

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

TokenType __thiscall wabt::WastParser::Peek(WastParser *this,size_t n)

{
  reference pvVar1;
  Token local_78;
  
  while ((this->tokens_).size_ <= n) {
    WastLexer::GetToken(&local_78,this->lexer_,this);
    CircularArray<wabt::Token,_2UL>::push_back(&this->tokens_,&local_78);
    Token::~Token(&local_78);
  }
  pvVar1 = CircularArray<wabt::Token,_2UL>::at(&this->tokens_,n);
  return pvVar1->token_type_;
}

Assistant:

TokenType WastParser::Peek(size_t n) {
  while (tokens_.size() <= n)
    tokens_.push_back(lexer_->GetToken(this));
  return tokens_.at(n).token_type();
}